

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O2

csafestring_t * json2map_concatPaths(char *parent,char *key,int arrayIdx)

{
  csafestring_t *obj;
  ulong uVar1;
  char *__format;
  char arrayIdxBuff [10];
  
  obj = safe_create((char *)0x0);
  if ((parent == (char *)0x0) || (*parent == '\0')) {
    safe_strcpy(obj,key);
  }
  else {
    safe_strcpy(obj,parent);
    safe_strchrappend(obj,'.');
    safe_strcat(obj,key);
  }
  if (arrayIdx < 0) {
    if (arrayIdx != -2) {
      return obj;
    }
    __format = "%c%c%c";
    uVar1 = 0x78;
  }
  else {
    __format = "%c%d%c";
    uVar1 = (ulong)(uint)arrayIdx;
  }
  sprintf(arrayIdxBuff,__format,0x5b,uVar1,0x5d);
  safe_strcat(obj,arrayIdxBuff);
  return obj;
}

Assistant:

static csafestring_t *json2map_concatPaths(char *parent, char *key, int arrayIdx) {
	DEBUG_TEXT("json2map_concatPaths(%s, %s, %d)...", parent, key, arrayIdx);

	char arrayIdxBuff[10];
	csafestring_t *buffer = safe_create(NULL);

	if ( parent != NULL && *parent != '\0' ) {
		safe_strcpy(buffer, parent);
		safe_strchrappend(buffer, JSON2MAP_MAP_OBJECT_SEPARATOR);
		safe_strcat(buffer, key);
	} else {
		safe_strcpy(buffer, key);
	}

	if ( arrayIdx >= 0 ) {
		sprintf(arrayIdxBuff, "%c%d%c", JSON2MAP_MAP_ARRAY_START, arrayIdx, JSON2MAP_MAP_ARRAY_END);
		safe_strcat(buffer, arrayIdxBuff);
	}
	if ( arrayIdx == -2 ) {
		sprintf(arrayIdxBuff, "%c%c%c", JSON2MAP_MAP_ARRAY_START, JSON2MAP_MAP_ARRAY_COUNT, JSON2MAP_MAP_ARRAY_END);
		safe_strcat(buffer, arrayIdxBuff);
	}

	DEBUG_TEXT("json2map_concatPaths(%s, %s, %d)... DONE", parent, key, arrayIdx);
	return buffer;
}